

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_canceluntil(sat_solver *s,int level)

{
  int iVar1;
  int iVar2;
  int v;
  int iVar3;
  int *piVar4;
  int local_20;
  int x;
  int c;
  int lastLev;
  int bound;
  int level_local;
  sat_solver *s_local;
  
  iVar1 = sat_solver_dl(s);
  if (level < iVar1) {
    iVar1 = veci_size(&s->trail_lim);
    if (iVar1 < 1) {
      __assert_fail("veci_size(&s->trail_lim) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x29c,"void sat_solver_canceluntil(sat_solver *, int)");
    }
    piVar4 = veci_begin(&s->trail_lim);
    iVar1 = piVar4[level];
    piVar4 = veci_begin(&s->trail_lim);
    iVar2 = veci_size(&s->trail_lim);
    iVar2 = piVar4[iVar2 + -1];
    local_20 = s->qtail;
    while (local_20 = local_20 + -1, iVar1 <= local_20) {
      v = lit_var(s->trail[local_20]);
      var_set_value(s,v,3);
      s->reasons[v] = 0;
      if (local_20 < iVar2) {
        iVar3 = lit_sign(s->trail[local_20]);
        var_set_polar(s,v,(uint)((iVar3 != 0 ^ 0xffU) & 1));
      }
    }
    local_20 = s->qhead;
    while (local_20 = local_20 + -1, iVar1 <= local_20) {
      iVar2 = lit_var(s->trail[local_20]);
      order_unassigned(s,iVar2);
    }
    s->qtail = iVar1;
    s->qhead = iVar1;
    veci_resize(&s->trail_lim,level);
  }
  return;
}

Assistant:

static void sat_solver_canceluntil(sat_solver* s, int level) {
    int      bound;
    int      lastLev;
    int      c;
    
    if (sat_solver_dl(s) <= level)
        return;

    assert( veci_size(&s->trail_lim) > 0 );
    bound   = (veci_begin(&s->trail_lim))[level];
    lastLev = (veci_begin(&s->trail_lim))[veci_size(&s->trail_lim)-1];

    ////////////////////////////////////////
    // added to cancel all assignments
//    if ( level == -1 )
//        bound = 0;
    ////////////////////////////////////////

    for (c = s->qtail-1; c >= bound; c--) {
        int     x  = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
        if ( c < lastLev )
            var_set_polar( s, x, !lit_sign(s->trail[c]) );
    }
    //printf( "\n" );

    for (c = s->qhead-1; c >= bound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = bound;
    veci_resize(&s->trail_lim,level);
}